

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaDevice.cpp
# Opt level: O2

void __thiscall xmrig::CudaDevice::toJSON(CudaDevice *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  uint32_t uVar1;
  size_t value;
  clock_t cVar2;
  undefined8 uVar3;
  Value health;
  NvmlHealth data;
  Value fanSpeed;
  Data local_158;
  Data local_140;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  StringRefType local_118;
  Data local_108;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_40.s = "name";
  local_40.length = 4;
  String::toJSON((String *)&local_140.s,(Document *)&this->m_name);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,&local_40,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_140.s,allocator);
  local_118.s = "bus_id";
  local_118.length = 6;
  PciTopology::toString((PciTopology *)&local_158.s);
  String::toJSON((String *)&local_140.s,(Document *)&local_158.s);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,&local_118,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_140.s,allocator);
  String::~String((String *)&local_158.s);
  local_50.s = "smx";
  local_50.length = 3;
  uVar1 = smx(this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(out,&local_50,uVar1,allocator);
  local_60.s = "arch";
  local_60.length = 4;
  uVar1 = arch(this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(out,&local_60,uVar1,allocator);
  local_70.s = "global_mem";
  local_70.length = 10;
  value = globalMemSize(this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(out,&local_70,value,allocator);
  local_80.s = "clock";
  local_80.length = 5;
  cVar2 = clock(this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(out,&local_80,(uint)cVar2,allocator);
  local_90.s = "memory_clock";
  local_90.length = 0xc;
  uVar1 = memoryClock(this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(out,&local_90,uVar1,allocator);
  if (this->m_nvmlDevice != (nvmlDevice_t)0x0) {
    NvmlLib::health((NvmlHealth *)&local_140.s,this->m_nvmlDevice);
    local_158.n = (Number)0x0;
    local_158.s.str = (Ch *)0x3000000000000;
    local_a0.s = "temperature";
    local_a0.length = 0xb;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_158.s,&local_a0,local_11c,allocator);
    local_b0.s = "power";
    local_b0.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_158.s,&local_b0,local_120,allocator);
    local_c0.s = "clock";
    local_c0.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_158.s,&local_c0,local_128,allocator);
    local_d0.s = "mem_clock";
    local_d0.length = 9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_158.s,&local_d0,local_124,allocator);
    local_108.n = (Number)0x0;
    local_108.s.str = (Ch *)0x4000000000000;
    for (uVar3 = local_140.n; (Ch *)uVar3 != local_140.s.str; uVar3 = uVar3 + 4) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_108.s,*(uint *)uVar3,allocator);
    }
    local_e0.s = "fan_speed";
    local_e0.length = 9;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,&local_e0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_108.s,allocator);
    local_f0.s = "health";
    local_f0.length = 6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(out,&local_f0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_158.s,allocator);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140.s);
  }
  return;
}

Assistant:

void xmrig::CudaDevice::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    out.AddMember("name",           name().toJSON(doc), allocator);
    out.AddMember("bus_id",         topology().toString().toJSON(doc), allocator);
    out.AddMember("smx",            smx(), allocator);
    out.AddMember("arch",           arch(), allocator);
    out.AddMember("global_mem",     static_cast<uint64_t>(globalMemSize()), allocator);
    out.AddMember("clock",          clock(), allocator);
    out.AddMember("memory_clock",   memoryClock(), allocator);

#   ifdef XMRIG_FEATURE_NVML
    if (m_nvmlDevice) {
        auto data = NvmlLib::health(m_nvmlDevice);

        Value health(kObjectType);
        health.AddMember("temperature", data.temperature, allocator);
        health.AddMember("power",       data.power, allocator);
        health.AddMember("clock",       data.clock, allocator);
        health.AddMember("mem_clock",   data.memClock, allocator);

        Value fanSpeed(kArrayType);
        for (auto speed : data.fanSpeed) {
            fanSpeed.PushBack(speed, allocator);
        }
        health.AddMember("fan_speed", fanSpeed, allocator);

        out.AddMember("health", health, allocator);
    }
#   endif
}